

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

void __thiscall
GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Vector::grow(Vector *this,uint newSize)

{
  uint uVar1;
  void **__dest;
  uint uVar2;
  
  uVar2 = (this->max >> 1) + this->max;
  uVar1 = newSize + 0x20;
  if (newSize < uVar2) {
    uVar1 = uVar2;
  }
  __dest = (void **)(*(code *)NULLC::alloc)(uVar1 * 8 + 4);
  if (this->data != (void **)0x0) {
    memcpy(__dest,this->data,(ulong)this->max << 3);
    if (this->data != (void **)0x0) {
      (*(code *)NULLC::dealloc)();
    }
  }
  this->data = __dest;
  this->max = uVar1;
  return;
}

Assistant:

void grow(unsigned newSize)
		{
			if(max + (max >> 1) > newSize)
				newSize = max + (max >> 1);
			else
				newSize += 32;

			void **newData;

			newData = NULLC::construct<void*>(newSize);

			if(data)
			{
				memcpy(newData, data, max * sizeof(void*));

				NULLC::destruct(data, max);
			}

			data = newData;
			max = newSize;
		}